

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O3

void websocket_on_unsubscribe(void *u1,void *u2)

{
  long lVar1;
  code *callback;
  
  if (*(code **)((long)u2 + 8) != (code *)0x0) {
    (**(code **)((long)u2 + 8))(*(undefined8 *)((long)u2 + 0x10));
  }
  lVar1 = *u2;
  if (lVar1 == -0x22) {
    LOCK();
    websocket_optimize4broadcasts::binary = websocket_optimize4broadcasts::binary + -1;
    UNLOCK();
    if (websocket_optimize4broadcasts::binary != 0) goto LAB_0015dfd3;
    callback = websocket_optimize_binary;
  }
  else if (lVar1 == -0x21) {
    LOCK();
    websocket_optimize4broadcasts::text = websocket_optimize4broadcasts::text + -1;
    UNLOCK();
    if (websocket_optimize4broadcasts::text != 0) goto LAB_0015dfd3;
    callback = websocket_optimize_text;
  }
  else {
    if (lVar1 != -0x20) goto LAB_0015dfd3;
    LOCK();
    websocket_optimize4broadcasts::generic = websocket_optimize4broadcasts::generic + -1;
    UNLOCK();
    if (websocket_optimize4broadcasts::generic != 0) goto LAB_0015dfd3;
    callback = websocket_optimize_generic;
  }
  fio_message_metadata_callback_set(callback,0);
LAB_0015dfd3:
  free(u2);
  return;
}

Assistant:

static void websocket_on_unsubscribe(void *u1, void *u2) {
  websocket_sub_data_s *d = u2;
  if (d->on_unsubscribe) {
    d->on_unsubscribe(d->udata);
  }

  if ((intptr_t)d->on_message == (intptr_t)WEBSOCKET_OPTIMIZE_PUBSUB) {
    websocket_optimize4broadcasts(WEBSOCKET_OPTIMIZE_PUBSUB, 0);
  } else if ((intptr_t)d->on_message ==
             (intptr_t)WEBSOCKET_OPTIMIZE_PUBSUB_TEXT) {
    websocket_optimize4broadcasts(WEBSOCKET_OPTIMIZE_PUBSUB_TEXT, 0);
  } else if ((intptr_t)d->on_message ==
             (intptr_t)WEBSOCKET_OPTIMIZE_PUBSUB_BINARY) {
    websocket_optimize4broadcasts(WEBSOCKET_OPTIMIZE_PUBSUB_BINARY, 0);
  }
  free(d);
  (void)u1;
}